

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

tcv_t * tcv_create(int index,i2c_read_cb_t read,i2c_write_cb_t write)

{
  int iVar1;
  tcv_t *__ptr;
  
  if ((write != (i2c_write_cb_t)0x0 && read != (i2c_read_cb_t)0x0) &&
     (__ptr = (tcv_t *)malloc(0x58), __ptr != (tcv_t *)0x0)) {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)&__ptr->lock,(pthread_mutexattr_t *)0x0);
    if (-1 < iVar1) {
      __ptr->index = index;
      __ptr->read = read;
      __ptr->write = write;
      __ptr->created = true;
      __ptr->initialized = false;
      __ptr->data = (void *)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (tcv_t *)0x0;
}

Assistant:

tcv_t * tcv_create(int index, i2c_read_cb_t read, i2c_write_cb_t write)
{
	tcv_t * tcv;
	/* Check parameters */
	if (read == NULL || write == NULL)
		return NULL ;

	tcv = (tcv_t*) malloc(sizeof(tcv_t));
	if (!tcv)
		return NULL ;

	/* initialize mutex */
	if (pthread_mutex_init(&tcv->lock, NULL) < 0) {
		free(tcv);
		return NULL ;
	}

	/* Initialize data */
	tcv->index = index;
	/* Provide basic read/write functions */
	tcv->read = read;
	tcv->write = write;
	tcv->created = true;
	/* initialize to be able to check in tcv_is_initialized() */
	tcv->data = NULL;
	tcv->initialized = false;
	return tcv;
}